

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void cfl_store_inter_block(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  CFL_ALLOWED_TYPE CVar1;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  MB_MODE_INFO *mbmi;
  TX_SIZE in_stack_0000002e;
  BLOCK_SIZE in_stack_0000002f;
  MACROBLOCKD *in_stack_00000030;
  
  CVar1 = store_cfl_required(in_RDI,in_RSI);
  if (CVar1 != '\0') {
    cfl_store_block(in_stack_00000030,in_stack_0000002f,in_stack_0000002e);
  }
  return;
}

Assistant:

static inline void cfl_store_inter_block(AV1_COMMON *const cm,
                                         MACROBLOCKD *const xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  if (store_cfl_required(cm, xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
}